

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.cpp
# Opt level: O0

void __thiscall unodb::test::QSBRTestBase::QSBRTestBase(QSBRTestBase *this)

{
  bool bVar1;
  qsbr_per_thread *this_00;
  qsbr *this_01;
  QSBRTestBase *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QSBRTestBase_001f9af0;
  detail::qsbr_epoch::qsbr_epoch(&this->last_epoch,'\0');
  bVar1 = is_qsbr_paused();
  if (bVar1) {
    this_00 = this_thread();
    qsbr_per_thread::qsbr_resume(this_00);
  }
  expect_idle_qsbr();
  this_01 = qsbr::instance();
  qsbr::reset_stats(this_01);
  return;
}

Assistant:

QSBRTestBase::QSBRTestBase() {
  if (is_qsbr_paused()) unodb::this_thread().qsbr_resume();
  unodb::test::expect_idle_qsbr();
#ifdef UNODB_DETAIL_WITH_STATS
  unodb::qsbr::instance().reset_stats();
#endif  // UNODB_DETAIL_WITH_STATS
}